

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O3

void Bac_NtkCreateOrConnectFanin(Abc_Obj_t *pFanin,Bac_Ntk_t *p,int iTerm)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Bac_Man_t *pBVar4;
  
  if (pFanin == (Abc_Obj_t *)0x0) {
    pBVar4 = p->pDesign;
    uVar3 = 0;
LAB_008bf25b:
    iVar2 = pBVar4->ElemGates[uVar3];
  }
  else {
    uVar1 = *(uint *)&pFanin->field_0x14 & 0xf;
    if (uVar1 != 2) {
      if ((uVar1 == 7) && (iVar2 = (pFanin->vFanins).nSize, 0 < iVar2)) {
        if ((iVar2 != 1) ||
           ((pFanin->pNtk->ntkFunc != ABC_FUNC_MAP || ((pFanin->field_5).pData != (void *)0x0)))) {
          iVar2 = (pFanin->field_6).iTemp;
          goto LAB_008bf284;
        }
        if (((pFanin->field_5).pData == (void *)0x0) || ((pFanin->field_5).pData != (void *)0x0))
        goto LAB_008bf215;
      }
      iVar2 = Abc_NodeIsConst0(pFanin);
      if (iVar2 == 0) {
        iVar2 = Abc_NodeIsConst1(pFanin);
        if (iVar2 == 0) {
          __assert_fail("!pFanin || Abc_NodeIsConst0(pFanin) || Abc_NodeIsConst1(pFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                        ,0x1e4,"void Bac_NtkCreateOrConnectFanin(Abc_Obj_t *, Bac_Ntk_t *, int)");
        }
      }
      pBVar4 = p->pDesign;
      iVar2 = Abc_NodeIsConst1(pFanin);
      uVar3 = (ulong)(iVar2 != 0);
      goto LAB_008bf25b;
    }
LAB_008bf215:
    Bac_ObjAlloc(p,BAC_OBJ_BI,(pFanin->field_6).iTemp);
    iVar2 = p->pDesign->ElemGates[2];
  }
  Bac_ObjAlloc(p,BAC_BOX_GATE,iVar2);
  iVar2 = Bac_ObjAlloc(p,BAC_OBJ_BO,-1);
LAB_008bf284:
  Bac_ObjSetFanin(p,iTerm,iVar2);
  return;
}

Assistant:

void Bac_NtkCreateOrConnectFanin( Abc_Obj_t * pFanin, Bac_Ntk_t * p, int iTerm )
{
    int iObj;
    if ( pFanin && Abc_NodeIsSeriousGate(pFanin) )//&& Bac_ObjName(p, pFanin->iTemp) == -1 ) // gate without name
    {
        iObj = pFanin->iTemp;
    }
    else if ( pFanin && (Abc_ObjIsPi(pFanin) || Abc_ObjIsBarBuf(pFanin) || Abc_NodeIsSeriousGate(pFanin)) ) // PI/BO or gate with name
    {
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BI, pFanin->iTemp );
        Bac_ObjAlloc( p, BAC_BOX_GATE, p->pDesign->ElemGates[2] ); // buffer
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    }
    else
    {
        assert( !pFanin || Abc_NodeIsConst0(pFanin) || Abc_NodeIsConst1(pFanin) );
        Bac_ObjAlloc( p, BAC_BOX_GATE, p->pDesign->ElemGates[(pFanin && Abc_NodeIsConst1(pFanin))] ); // const 0/1
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    }
    Bac_ObjSetFanin( p, iTerm, iObj );
}